

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O2

int compare_list(char **name,void **list,zip_uint64_t *list_length,int element_size,
                _func_int_void_ptr_void_ptr *cmp,_func_int_void_ptr_int_void_ptr *ignore,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_char_void_ptr *print,
                _func_void_void_ptr *start_file)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  void *pvVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int *piVar15;
  uint local_48 [2];
  char **local_40;
  _func_int_void_ptr_void_ptr *local_38;
  
  ppvVar1 = list + 1;
  uVar6 = (ulong)(uint)element_size;
  uVar13 = 0;
  uVar11 = 0;
  uVar12 = 0;
  local_40 = name;
  local_38 = cmp;
  do {
    uVar10 = (uint)uVar11;
    if ((*list_length <= uVar11) || (uVar14 = (ulong)uVar13, list_length[1] <= uVar14)) {
      local_48[0] = uVar10;
      local_48[1] = uVar13;
      lVar9 = 0;
      do {
        if (lVar9 == 2) {
          return uVar12;
        }
        uVar13 = local_48[lVar9];
        lVar8 = 1 - lVar9;
        piVar15 = &plus_count;
        if (lVar9 == 0) {
          piVar15 = &minus_count;
        }
        while( true ) {
          if (list_length[lVar9] <= (ulong)uVar13) break;
          pvVar5 = list[lVar9];
          if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_0010341b:
            (*print)((lVar9 == 0) * '\x02' + '+',pvVar5);
            *piVar15 = *piVar15 + 1;
            uVar12 = 1;
          }
          else {
            if ((ulong)local_48[lVar8] < list_length[lVar8]) {
              pvVar7 = list[lVar8];
            }
            else {
              pvVar7 = (void *)0x0;
            }
            iVar2 = (*ignore)(pvVar5,SUB14(list_length[lVar9] - 1 <= (ulong)uVar13,0),pvVar7);
            if (iVar2 == 0) {
              pvVar5 = list[lVar9];
              goto LAB_0010341b;
            }
          }
          uVar13 = uVar13 + 1;
          local_48[lVar9] = uVar13;
          list[lVar9] = (void *)((long)list[lVar9] + uVar6);
        }
        lVar9 = lVar9 + 1;
      } while( true );
    }
    iVar2 = (*local_38)(*list,list[1]);
    ppvVar4 = ppvVar1;
    if (iVar2 == 0) {
      if (check != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
        if (start_file != (_func_void_void_ptr *)0x0) {
          (*start_file)(*list);
        }
        uVar3 = (*check)(local_40,*list,list[1]);
        uVar12 = uVar3 | uVar12;
        if (start_file != (_func_void_void_ptr *)0x0) {
          diff_output_end_file(&output);
        }
      }
      *list = (void *)((long)*list + uVar6);
      uVar11 = (ulong)(uVar10 + 1);
      uVar13 = uVar13 + 1;
    }
    else if (iVar2 < 0) {
      if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_00103353:
        (*print)('-',*list);
        minus_count = minus_count + 1;
        uVar12 = 1;
      }
      else {
        if (uVar14 < list_length[1]) {
          pvVar5 = *ppvVar1;
        }
        else {
          pvVar5 = (void *)0x0;
        }
        iVar2 = (*ignore)(*list,SUB14(*list_length - 1 <= uVar11,0),pvVar5);
        if (iVar2 == 0) goto LAB_00103353;
      }
      uVar11 = (ulong)(uVar10 + 1);
      ppvVar4 = list;
    }
    else {
      if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_0010330d:
        (*print)('+',*ppvVar1);
        plus_count = plus_count + 1;
        uVar12 = 1;
      }
      else {
        if (uVar11 < *list_length) {
          pvVar5 = *list;
        }
        else {
          pvVar5 = (void *)0x0;
        }
        iVar2 = (*ignore)(*ppvVar1,SUB14(list_length[1] - 1 <= uVar14,0),pvVar5);
        if (iVar2 == 0) goto LAB_0010330d;
      }
      uVar13 = uVar13 + 1;
    }
    *ppvVar4 = (void *)((long)*ppvVar4 + uVar6);
  } while( true );
}

Assistant:

static int
compare_list(char *const name[2], const void *list[2], const zip_uint64_t list_length[2], int element_size, int (*cmp)(const void *a, const void *b), int (*ignore)(const void *list, int last, const void *other), int (*check)(char *const name[2], const void *a, const void *b), void (*print)(char side, const void *element), void (*start_file)(const void *element)) {
    unsigned int i[2];
    int j;
    int diff;

#define INC(k) (i[k]++, list[k] = ((const char *)list[k]) + element_size)
#define PRINT(k)                                                                                                         \
    do {                                                                                                                 \
        if (ignore && ignore(list[k], i[k] >= list_length[k] - 1, i[1 - k] < list_length[1 - k] ? list[1 - k] : NULL)) { \
            break;                                                                                                       \
        }                                                                                                                \
        print((k) ? '+' : '-', list[k]);                                                                                 \
        (k) ? plus_count++ : minus_count++;                                                                              \
        diff = 1;                                                                                                        \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < list_length[0] && i[1] < list_length[1]) {
        int c = cmp(list[0], list[1]);

        if (c == 0) {
            if (check) {
                if (start_file) {
                    start_file(list[0]);
                }
                diff |= check(name, list[0], list[1]);
                if (start_file) {
                    diff_output_end_file(&output);
                }
            }
            INC(0);
            INC(1);
        }
        else if (c < 0) {
            PRINT(0);
            INC(0);
        }
        else {
            PRINT(1);
            INC(1);
        }
    }

    for (j = 0; j < 2; j++) {
        while (i[j] < list_length[j]) {
            PRINT(j);
            INC(j);
        }
    }

    return diff;
}